

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

int __thiscall lan::db::connect(db *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined8 uVar2;
  int __oflag;
  undefined4 in_register_00000034;
  string local_38 [32];
  string *local_18;
  string *filename_local;
  db *this_local;
  
  local_18 = (string *)CONCAT44(in_register_00000034,__fd);
  filename_local = (string *)this;
  std::__cxx11::string::string(local_38,local_18);
  iVar1 = safe_file::open(&this->file,(char *)local_38,__oflag);
  uVar2 = std::__cxx11::string::~string(local_38);
  return (uint)CONCAT71((int7)((ulong)uVar2 >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool db::connect(std::string filename){
            return file.open(filename);
        }